

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O1

double __thiscall
FIX::double_conversion::Strtod(double_conversion *this,Vector<const_char> buffer,int exponent)

{
  bool bVar1;
  int iVar2;
  double_conversion **guess_00;
  Vector<const_char> trimmed_00;
  Vector<const_char> buffer_00;
  Vector<const_char> buffer_01;
  DiyFp DVar3;
  DiyFp diy_fp;
  double guess;
  int updated_exponent;
  Vector<const_char> trimmed;
  char copy_buffer [780];
  int *in_stack_fffffffffffffc98;
  double dVar4;
  double local_360;
  undefined1 local_354 [12];
  double_conversion *local_348;
  uint local_340;
  char local_338 [792];
  
  buffer_00._8_8_ = buffer.start_;
  guess_00 = &local_348;
  local_348 = (double_conversion *)0x0;
  local_340 = 0;
  buffer_00.start_ = (char *)this;
  TrimAndCut(buffer_00,buffer.length_,local_338,(int)guess_00,(Vector<const_char> *)local_354,
             in_stack_fffffffffffffc98);
  buffer_01.length_ = local_340;
  buffer_01.start_ = (char *)local_348;
  trimmed_00.start_ = (ulong)local_340;
  trimmed_00.length_ = local_354._0_4_;
  trimmed_00._12_4_ = 0;
  bVar1 = ComputeGuess(local_348,trimmed_00,(int)&local_360,(double *)guess_00);
  if (!bVar1) {
    local_354._4_8_ = local_360;
    DVar3 = Double::UpperBoundary((Double *)(local_354 + 4));
    buffer_01._12_4_ = 0;
    diy_fp._12_4_ = 0;
    diy_fp.f_ = SUB128(DVar3._0_12_,0);
    diy_fp.e_ = SUB124(DVar3._0_12_,8);
    dVar4 = local_360;
    iVar2 = CompareBufferWithDiyFp(buffer_01,local_354._0_4_,diy_fp);
    local_360 = dVar4;
    if ((-1 < iVar2) && ((iVar2 != 0 || (((ulong)dVar4 & 1) != 0)))) {
      if (dVar4 == INFINITY) {
        local_360 = INFINITY;
      }
      else if ((long)dVar4 < 0) {
        if ((dVar4 != 0.0) || (local_360 = 0.0, NAN(dVar4))) {
          local_360 = (double)((long)dVar4 + -1);
        }
      }
      else {
        local_360 = (double)((long)dVar4 + 1);
      }
    }
  }
  return local_360;
}

Assistant:

double Strtod(Vector<const char> buffer, int exponent) {
  char copy_buffer[kMaxSignificantDecimalDigits];
  Vector<const char> trimmed;
  int updated_exponent;
  TrimAndCut(buffer, exponent, copy_buffer, kMaxSignificantDecimalDigits,
             &trimmed, &updated_exponent);
  exponent = updated_exponent;

  double guess;
  bool is_correct = ComputeGuess(trimmed, exponent, &guess);
  if (is_correct) return guess;

  DiyFp upper_boundary = Double(guess).UpperBoundary();
  int comparison = CompareBufferWithDiyFp(trimmed, exponent, upper_boundary);
  if (comparison < 0) {
    return guess;
  } else if (comparison > 0) {
    return Double(guess).NextDouble();
  } else if ((Double(guess).Significand() & 1) == 0) {
    // Round towards even.
    return guess;
  } else {
    return Double(guess).NextDouble();
  }
}